

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O1

void __thiscall
capnp::compiler::Compiler::Node::traverseDependency
          (Node *this,uint64_t depId,uint eagerness,
          unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
          *seen,SchemaLoader *finalLoader,
          Vector<capnp::schema::Node::SourceInfo::Reader> *sourceInfo,bool ignoreIfNotFound)

{
  Fault f;
  uint64_t depId_local;
  
  depId_local = depId;
  Impl::findNode((Impl *)&f,(uint64_t)this->module->compiler);
  if (f.exception != (Exception *)0x0) {
    traverse((Node *)f.exception,eagerness,seen,finalLoader,sourceInfo);
    return;
  }
  if (ignoreIfNotFound) {
    return;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[39],unsigned_long&>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/compiler.c++"
             ,0x34c,FAILED,(char *)0x0,"\"Dependency ID not present in compiler?\", depId",
             (char (*) [39])"Dependency ID not present in compiler?",&depId_local);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

void Compiler::Node::traverseDependency(uint64_t depId, uint eagerness,
                                        std::unordered_map<Node*, uint>& seen,
                                        const SchemaLoader& finalLoader,
                                        kj::Vector<schema::Node::SourceInfo::Reader>& sourceInfo,
                                        bool ignoreIfNotFound) {
  KJ_IF_SOME(node, module->getCompiler().findNode(depId)) {
    node.traverse(eagerness, seen, finalLoader, sourceInfo);
  } else if (!ignoreIfNotFound) {
    KJ_FAIL_ASSERT("Dependency ID not present in compiler?", depId);
  }
}